

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue JS_GetPropertyInt64(JSContext *ctx,JSValue obj,int64_t idx)

{
  JSAtom prop;
  ulong uVar1;
  JSValue JVar2;
  JSValue JVar3;
  
  if ((ulong)idx < 0x80000000) {
    JVar2.tag = 0;
    JVar2.u = (JSValueUnion)idx;
    JVar2 = JS_GetPropertyValue(ctx,obj,JVar2);
    uVar1 = (ulong)JVar2.u.ptr & 0xffffffff00000000;
  }
  else {
    prop = JS_NewAtomInt64(ctx,idx);
    if (prop == 0) {
      JVar2 = (JSValue)(ZEXT816(6) << 0x40);
      uVar1 = 0;
    }
    else {
      JVar2 = JS_GetPropertyInternal(ctx,obj,prop,obj,0);
      JS_FreeAtom(ctx,prop);
      uVar1 = (ulong)JVar2.u.ptr & 0xffffffff00000000;
    }
  }
  JVar3.u.ptr = (void *)((ulong)JVar2.u.ptr & 0xffffffff | uVar1);
  JVar3.tag = JVar2.tag;
  return JVar3;
}

Assistant:

static JSValue JS_GetPropertyInt64(JSContext *ctx, JSValueConst obj, int64_t idx)
{
    JSAtom prop;
    JSValue val;

    if ((uint64_t)idx <= INT32_MAX) {
        /* fast path for fast arrays */
        return JS_GetPropertyValue(ctx, obj, JS_NewInt32(ctx, idx));
    }
    prop = JS_NewAtomInt64(ctx, idx);
    if (prop == JS_ATOM_NULL)
        return JS_EXCEPTION;

    val = JS_GetProperty(ctx, obj, prop);
    JS_FreeAtom(ctx, prop);
    return val;
}